

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O0

void __thiscall I2cAnalyzer::I2cAnalyzer(I2cAnalyzer *this)

{
  I2cAnalyzerSettings *this_00;
  I2cAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__I2cAnalyzer_0010fca0;
  this_00 = (I2cAnalyzerSettings *)operator_new(0x40);
  I2cAnalyzerSettings::I2cAnalyzerSettings(this_00);
  std::auto_ptr<I2cAnalyzerSettings>::auto_ptr(&this->mSettings,this_00);
  std::auto_ptr<I2cAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  I2cSimulationDataGenerator::I2cSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&this->mArrowLocations);
  std::auto_ptr<I2cAnalyzerSettings>::get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

I2cAnalyzer::I2cAnalyzer() : Analyzer2(), mSettings( new I2cAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}